

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall CMU462::Camera::copy_placement(Camera *this,Camera *other)

{
  Camera *other_local;
  Camera *this_local;
  
  (this->pos).x = (other->pos).x;
  (this->pos).y = (other->pos).y;
  (this->pos).z = (other->pos).z;
  (this->targetPos).x = (other->targetPos).x;
  (this->targetPos).y = (other->targetPos).y;
  (this->targetPos).z = (other->targetPos).z;
  this->phi = other->phi;
  this->theta = other->theta;
  this->minR = other->minR;
  this->maxR = other->maxR;
  memcpy(&this->c2w,&other->c2w,0x48);
  return;
}

Assistant:

void Camera::copy_placement(const Camera& other) {
    pos = other.pos;
    targetPos = other.targetPos;
    phi = other.phi;
    theta = other.theta;
    minR = other.minR;
    maxR = other.maxR;
    c2w = other.c2w;
  }